

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraint.c
# Opt level: O1

void test_true(Constraint *constraint,char *function,CgreenValue actual,char *test_file,
              int test_line,TestReporter *reporter)

{
  return;
}

Assistant:

static void test_true(Constraint *constraint, const char *function, CgreenValue actual,
                      const char *test_file, int test_line, TestReporter *reporter) {
    (void)constraint;
    (void)function;
    (void)actual;
    (void)test_file;
    (void)test_line;
    (void)reporter;
}